

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long __thiscall mkvparser::Cluster::CreateSimpleBlock(Cluster *this,longlong st,longlong sz)

{
  BlockEntry **ppBVar1;
  long idx;
  SimpleBlock *this_00;
  long lVar2;
  
  ppBVar1 = this->m_entries;
  idx = this->m_entries_count;
  this_00 = (SimpleBlock *)operator_new(0x50,(nothrow_t *)&std::nothrow);
  if (this_00 == (SimpleBlock *)0x0) {
    ppBVar1[idx] = (BlockEntry *)0x0;
    lVar2 = -1;
  }
  else {
    SimpleBlock::SimpleBlock(this_00,this,idx,st,sz);
    ppBVar1[idx] = (BlockEntry *)this_00;
    lVar2 = SimpleBlock::Parse(this_00);
    if (lVar2 == 0) {
      this->m_entries_count = this->m_entries_count + 1;
      lVar2 = 0;
    }
    else {
      if (ppBVar1[idx] != (BlockEntry *)0x0) {
        (*ppBVar1[idx]->_vptr_BlockEntry[1])();
      }
      ppBVar1[idx] = (BlockEntry *)0x0;
    }
  }
  return lVar2;
}

Assistant:

long Cluster::CreateSimpleBlock(long long st, long long sz) {
  assert(m_entries);
  assert(m_entries_size > 0);
  assert(m_entries_count >= 0);
  assert(m_entries_count < m_entries_size);

  const long idx = m_entries_count;

  BlockEntry** const ppEntry = m_entries + idx;
  BlockEntry*& pEntry = *ppEntry;

  pEntry = new (std::nothrow) SimpleBlock(this, idx, st, sz);

  if (pEntry == NULL)
    return -1;  // generic error

  SimpleBlock* const p = static_cast<SimpleBlock*>(pEntry);

  const long status = p->Parse();

  if (status == 0) {
    ++m_entries_count;
    return 0;
  }

  delete pEntry;
  pEntry = 0;

  return status;
}